

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_read(void)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int size;
  bson_oid_t oid;
  
  bson_oid_init_from_string(&oid,"000000000000000000000000");
  uVar1 = bson_bcon_magic();
  uVar2 = bcon_new(0x405edd2f1a9fbe77,0,"foo","bar","bar",uVar1,0xf,0x3035,"baz",uVar1,1,"map","{",
                   "a",uVar1,0xf,1,"}","array","[",uVar1,0xf,1,uVar1,0xf,2,uVar1,0xf,3,uVar1,0xf,4,
                   "]","null",uVar1,9,"boolean",uVar1,7,1,"oid",uVar1,6,&oid,"binary",uVar1,4,0,
                   "deadbeef",8,"regex",uVar1,10,"foo|bar","ism","date",uVar1,8,10000,"ref","{",
                   "$ref",uVar1,0,"foo","$id",uVar1,6,&oid);
  uVar3 = bcon_new(0,"after","b",0);
  size = 0x147e7e;
  uVar1 = bcon_new(0,"twice",uVar1,7,1,0);
  _test_bson_json_read_compare
            ("{ \n      \"foo\" : \"bar\", \n      \"bar\" : 12341, \n      \"baz\" : 123.456, \n      \"map\" : { \"a\" : 1 }, \n      \"array\" : [ 1, 2, 3, 4 ], \n      \"null\" : null, \n      \"boolean\" : true, \n      \"oid\" : { \n        \"$oid\" : \"000000000000000000000000\" \n      }, \n      \"binary\" : { \n        \"$type\" : \"00\", \n        \"$binary\" : \"ZGVhZGJlZWY=\" \n      }, \n      \"regex\" : { \n        \"$regularExpression\" : { \n          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n        } \n      }, \n      \"date\" : { \n        \"$date\" : \"1970-01-01T00:00:10Z\" \n      }, \n      \"ref\" : { \n        \"$ref\" : \"foo\", \n        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n      }, \n      \"undefined\" : { \n        \"$undefined\" : true \n      }, \n      \"minkey\" : { \n        \"$minKey\" : 1 \n      }, \n      \"maxkey\" : { \n        \"$maxKey\" : 1 \n      }, \n      \"timestamp\" : { \n        \"$timestamp\" : { \n           \"t\" : 100, \n           \"i\" : 1000 \n        } \n      } \n   } { \"after\": \"b\" } { \"twice\" : true }"
             ,size,uVar2,uVar3,uVar1,0);
  return;
}

Assistant:

static void
test_bson_json_read (void)
{
   const char *json = "{ \n\
      \"foo\" : \"bar\", \n\
      \"bar\" : 12341, \n\
      \"baz\" : 123.456, \n\
      \"map\" : { \"a\" : 1 }, \n\
      \"array\" : [ 1, 2, 3, 4 ], \n\
      \"null\" : null, \n\
      \"boolean\" : true, \n\
      \"oid\" : { \n\
        \"$oid\" : \"000000000000000000000000\" \n\
      }, \n\
      \"binary\" : { \n\
        \"$type\" : \"00\", \n\
        \"$binary\" : \"ZGVhZGJlZWY=\" \n\
      }, \n\
      \"regex\" : { \n\
        \"$regularExpression\" : { \n\
          \"pattern\": \"foo|bar\", \"options\" : \"ism\" \n\
        } \n\
      }, \n\
      \"date\" : { \n\
        \"$date\" : \"1970-01-01T00:00:10Z\" \n\
      }, \n\
      \"ref\" : { \n\
        \"$ref\" : \"foo\", \n\
        \"$id\" : {\"$oid\": \"000000000000000000000000\"} \n\
      }, \n\
      \"undefined\" : { \n\
        \"$undefined\" : true \n\
      }, \n\
      \"minkey\" : { \n\
        \"$minKey\" : 1 \n\
      }, \n\
      \"maxkey\" : { \n\
        \"$maxKey\" : 1 \n\
      }, \n\
      \"timestamp\" : { \n\
        \"$timestamp\" : { \n\
           \"t\" : 100, \n\
           \"i\" : 1000 \n\
        } \n\
      } \n\
   } { \"after\": \"b\" } { \"twice\" : true }";

   bson_oid_t oid;
   bson_t *first, *second, *third;

   bson_oid_init_from_string (&oid, "000000000000000000000000");

   first =
      BCON_NEW ("foo",
                "bar",
                "bar",
                BCON_INT32 (12341),
                "baz",
                BCON_DOUBLE (123.456),
                "map",
                "{",
                "a",
                BCON_INT32 (1),
                "}",
                "array",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                BCON_INT32 (3),
                BCON_INT32 (4),
                "]",
                "null",
                BCON_NULL,
                "boolean",
                BCON_BOOL (true),
                "oid",
                BCON_OID (&oid),
                "binary",
                BCON_BIN (BSON_SUBTYPE_BINARY, (const uint8_t *) "deadbeef", 8),
                "regex",
                BCON_REGEX ("foo|bar", "ism"),
                "date",
                BCON_DATE_TIME (10000),
                "ref",
                "{",
                "$ref",
                BCON_UTF8 ("foo"),
                "$id",
                BCON_OID (&oid),
                "}",
                "undefined",
                BCON_UNDEFINED,
                "minkey",
                BCON_MINKEY,
                "maxkey",
                BCON_MAXKEY,
                "timestamp",
                BCON_TIMESTAMP (100, 1000));

   second = BCON_NEW ("after", "b");
   third = BCON_NEW ("twice", BCON_BOOL (true));

   _test_bson_json_read_compare (json, 5, first, second, third, NULL);
}